

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cache.c
# Opt level: O3

int main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  time_t tVar6;
  char *__dest;
  record_data *prVar7;
  clock_t cVar8;
  clock_t cVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  cache *pcVar13;
  int i;
  ulong uVar14;
  int iVar15;
  record_data tmp_data;
  record_data *send_data [10];
  record_data _data [10];
  char *local_348 [2];
  ip local_338;
  uchar local_328;
  undefined7 uStack_327;
  undefined8 uStack_320;
  time_t local_318;
  undefined8 local_310;
  long *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  long local_2b8 [8];
  undefined1 local_278 [64];
  undefined1 local_238 [64];
  undefined1 local_1f8 [456];
  
  log_set_level(2);
  tVar6 = time((time_t *)0x0);
  srand((uint)tVar6);
  init_records();
  pcVar13 = &testcache;
  init_A_record_cache_default(&testcache);
  local_310 = 0;
  __dest = (char *)malloc(0x100);
  local_348[0] = __dest;
  strcpy(__dest,records[0].label);
  local_338 = records[0].ip.addr;
  local_328 = records[0].ip.type;
  uStack_327 = records[0].ip._17_7_;
  uStack_320 = records[0].ip._24_8_;
  tVar6 = time((time_t *)0x0);
  local_318 = tVar6 + 1000000;
  set_cache_A_record(&testcache,__dest,local_348);
  prVar7 = get_cache_A_record(&testcache,records[0].label);
  if (prVar7 != (record_data *)0x0) {
    iVar15 = 100000;
    cVar8 = clock();
    do {
      iVar4 = rand();
      if (((ulong)((long)pcVar13 * 0x1cac083126e978d5) >> 2 |
          (long)pcVar13 * 0x1cac083126e978d5 << 0x3e) < 0x83126e978d4fe0) {
        pcVar13 = (cache *)time((time_t *)0x0);
      }
      uVar5 = iVar4 % 2000;
      if ((uVar5 & 3) == 0) {
        log_log(1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
                ,0x3b,"set cache");
        strcpy(local_348[0],records[(int)uVar5].label);
        local_338 = *(ip *)(records + (int)uVar5);
        local_328 = records[(int)uVar5].ip.type;
        uStack_327 = *(undefined7 *)&records[(int)uVar5].ip.field_0x11;
        uStack_320 = *(undefined8 *)&records[(int)uVar5].ip.field_0x18;
        local_318 = records[(int)uVar5].ttl;
        set_cache_A_record(&testcache,local_348[0],local_348);
      }
      else {
        log_log(1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
                ,0x42,"get cache");
        prVar7 = get_cache_A_record(&testcache,records[(int)uVar5].label);
        if (prVar7 == (record_data *)0x0) {
          log_log(1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
                  ,0x47,"No exist\n");
        }
        else {
          log_log(1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
                  ,0x45,"%s\n",prVar7->label);
        }
      }
      test_normal(&testcache);
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    cVar9 = clock();
    test_normal(&testcache);
    log_log(2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
            ,0x4f,"test 100000 randomly insert and get successfully in %f",
            SUB84((double)(cVar9 - cVar8) / 1000000.0,0));
    uVar14 = 0;
    do {
      log_log(1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
              ,0x54,"iter=%d\n",uVar14);
      iVar15 = rand();
      if (((ulong)((long)pcVar13 * 0x1cac083126e978d5) >> 2 |
          (long)pcVar13 * 0x1cac083126e978d5 << 0x3e) < 0x83126e978d4fe0) {
        pcVar13 = (cache *)time((time_t *)0x0);
      }
      uVar5 = iVar15 % 0x7cc;
      lVar10 = (long)(int)uVar5;
      if (uVar5 == 0 || (uVar5 & 3) != 0) {
        log_log(1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
                ,0x68,"get cache label=%s",records[lVar10].label);
        get_cache_A_record(&testcache,records[lVar10].label);
      }
      else {
        lVar11 = lVar10 * 0x130 + 0x105290;
        lVar12 = 0;
        do {
          uVar1 = *(undefined8 *)(lVar11 + -0x30);
          uVar2 = *(undefined8 *)(lVar11 + -0x28);
          uVar3 = *(undefined8 *)(lVar11 + -0x18);
          *(undefined8 *)((long)local_2b8 + lVar12 + 0x20) = *(undefined8 *)(lVar11 + -0x20);
          *(undefined8 *)((long)local_2b8 + lVar12 + 0x28) = uVar3;
          *(undefined8 *)((long)local_2b8 + lVar12 + 0x10) = uVar1;
          *(undefined8 *)((long)local_2b8 + lVar12 + 0x18) = uVar2;
          *(undefined8 *)((long)local_2b8 + lVar12 + 0x30) = *(undefined8 *)(lVar11 + -0x10);
          *(long *)((long)local_2b8 + lVar12) = lVar11;
          lVar12 = lVar12 + 0x40;
          lVar11 = lVar11 + 0x130;
        } while (lVar12 != 0x100);
        local_308 = local_2b8;
        local_2f8 = local_278;
        local_300 = local_238;
        local_2f0 = local_1f8;
        set_cache_A_multi_record(&testcache,records[lVar10].label,&local_308,4);
      }
      uVar5 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar5;
    } while (uVar5 != 10000);
    free_cache(&testcache);
    printf(anon_var_dwarf_1f1);
    return 0;
  }
  log_log(4,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_cache.c"
          ,0x33,"can\'t get cache");
  exit(0);
}

Assistant:

int main(){
    log_set_level(LOG_INFO);
    srand(time(NULL));
    init_records();
    // printf("%d",_hash("www.baidu.com1",1000))
    init_A_record_cache_default(&testcache);
    size_t now;
    // printf("%d %d",testcache.length,testcache.max_size);

    struct record_data tmp_data;
    tmp_data.next=NULL;
    tmp_data.label = malloc(256); 
    strcpy(tmp_data.label,records[0].label);
    // strcpy_s(tmp_data.label,256,records[0].label);
    tmp_data.ip = records[0].ip;
    tmp_data.ttl = time(NULL)+1000000;
    set_cache_A_record(&testcache,tmp_data.label,(void*)&tmp_data);    
    struct record_data *tmp = get_cache_A_record(&testcache,(const char*)records[0].label);
    if(!tmp){log_error("can't get cache",tmp->label);exit(0);}

    clock_t start_time = clock(),end_time;
    for (int i =0;i<100000;i++){
        int r = rand() % 2000;
        // log_debug("%d",i);
        if(now%500==0)now =time(NULL);
        if(r%4==0){
            log_debug("set cache");
            strcpy(tmp_data.label,records[r].label);
            // strcpy_s(tmp_data.label,256,records[r].label);
            tmp_data.ip = records[r].ip;
            tmp_data.ttl = records[r].ttl;
            set_cache_A_record(&testcache,tmp_data.label,&tmp_data);
        }else{
            log_debug("get cache");
            struct record_data *tmp = get_cache_A_record(&testcache,(const char*)records[r].label);
            if(tmp)
                log_debug("%s\n",tmp->label);
            else   
                log_debug("No exist\n");
        }
        // printf("%s\n",records[r].label);
        test_normal(&testcache);
        // printf("\n");
    }
    end_time = clock();
    test_normal(&testcache);
    log_info("test 100000 randomly insert and get successfully in %f",(double)(end_time - start_time) / CLOCKS_PER_SEC);

    struct record_data* send_data[10];
    struct record_data _data[10];
    for (int i =0;i<10000;i++){
        log_debug("iter=%d\n",i);
        int r = rand() % 1996;
        if(now%500==0)now =time(NULL);

        if(r%4==0&&r!=0){
            for(int j=0;j<4;j++){
                memcpy(&_data[j].ip,&records[r+j].ip,sizeof(struct IP));
                // memcpy_s(&_data[j].ip,sizeof(struct IP),&records[r+j].ip,sizeof(struct IP));
                _data[j].ttl = records[r+j].ttl;
                _data[j].label = records[r+j].label;
            }
            send_data[0] = &_data[0];
            send_data[2] = &_data[1];
            send_data[1] = &_data[2];
            send_data[3] = &_data[3];
            // printf("%s",send_data[0]->label);
            // puts(send_data[0]);
            // set_cache_A_record(&testcache,tmp_data.label,&tmp_data);
            set_cache_A_multi_record(&testcache,records[r].label,(void**)send_data,4);
        }else{
            log_debug("get cache label=%s",records[r].label);
            get_cache_A_record(&testcache,(const char*)records[r].label);
        }
    }
    // printf("%d",set_cache_A_record((const char*)&records[0].label,&records[0].ip));
    // printf("%d",_cache((const char*)&records[0].label,&records[0].ip));
    free_cache(&testcache);
    printf("恭喜！\nおめでとうございます\nCongratulations!");
    return 0;
}